

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupPerm(Gia_Man_t *p,Vec_Int_t *vPiPerm)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  
  if (vPiPerm->nSize != p->vCis->nSize - p->nRegs) {
    __assert_fail("Vec_IntSize(vPiPerm) == Gia_ManPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0x33f,"Gia_Man_t *Gia_ManDupPerm(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_00->pName = pcVar8;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar3);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar3);
  }
  p_00->pSpec = pcVar8;
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar12 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar13 = 0;
    do {
      if ((int)uVar12 <= lVar13) goto LAB_001dbb08;
      if ((pVVar9->pArray[lVar13] < 0) || (p->nObjs <= pVVar9->pArray[lVar13])) {
LAB_001dbae9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001dbaca;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001dbaca;
      if (vPiPerm->nSize <= lVar13) {
LAB_001dbb08:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar1 = vPiPerm->pArray[lVar13];
      iVar6 = p->vCis->nSize;
      if (iVar6 - p->nRegs <= (int)uVar1) {
        __assert_fail("v < Gia_ManPiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d4,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
      }
      if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) goto LAB_001dbb08;
      iVar6 = p->vCis->pArray[uVar1];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001dbae9;
      p->pObjs[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar13 = lVar13 + 1;
      pVVar9 = p->vCis;
      uVar12 = (ulong)pVVar9->nSize;
    } while (lVar13 < (long)(uVar12 - (long)p->nRegs));
  }
  if (1 < p->nObjs) {
    lVar14 = 1;
    lVar13 = 0x14;
    do {
      pGVar4 = p->pObjs;
      uVar12 = *(ulong *)((long)pGVar4 + lVar13 + -8);
      uVar5 = (uint)uVar12;
      iVar6 = (int)(uVar12 & 0x1fffffff);
      uVar1 = (uint)(uVar12 >> 0x20);
      if ((uVar12 & 0x1fffffff) == 0x1fffffff || (int)uVar5 < 0) {
        if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
          if (p->vCis->nSize - p->nRegs <= (int)(uVar1 & 0x1fffffff)) {
            pGVar11 = Gia_ManAppendObj(p_00);
            uVar12 = *(ulong *)pGVar11;
            *(ulong *)pGVar11 = uVar12 | 0x9fffffff;
            *(ulong *)pGVar11 =
                 uVar12 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar10 = p_00->pObjs;
            if ((pGVar10 <= pGVar11) && (pGVar11 < pGVar10 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
              pGVar10 = p_00->pObjs;
              if ((pGVar10 <= pGVar11) && (pGVar11 < pGVar10 + p_00->nObjs)) {
                iVar6 = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
                goto LAB_001dba95;
              }
            }
LAB_001dbaca:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
        }
        else if ((int)uVar5 < 0 && iVar6 != 0x1fffffff) {
          uVar1 = *(uint *)((long)pGVar4 + lVar13 + (ulong)(uint)(iVar6 << 2) * -3);
          if ((int)uVar1 < 0) goto LAB_001dbb27;
          iVar6 = Gia_ManAppendCo(p_00,uVar1 ^ uVar5 >> 0x1d & 1);
          goto LAB_001dba95;
        }
      }
      else {
        uVar5 = *(uint *)((long)pGVar4 + lVar13 + (ulong)(uint)(iVar6 << 2) * -3);
        if (((int)uVar5 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar13 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) {
LAB_001dbb27:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar6 = Gia_ManAppendAnd(p_00,uVar5 ^ (uint)(uVar12 >> 0x1d) & 1,uVar2 ^ uVar1 >> 0x1d & 1);
LAB_001dba95:
        *(int *)(&pGVar4->field_0x0 + lVar13) = iVar6;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPerm( Gia_Man_t * p, Vec_Int_t * vPiPerm )
{
//    Vec_Int_t * vPiPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vPiPerm) == Gia_ManPiNum(p) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
//    vPiPermInv = Vec_IntInvert( vPiPerm, -1 );
    Gia_ManForEachPi( p, pObj, i )
//        Gia_ManPi(p, Vec_IntEntry(vPiPermInv,i))->Value = Gia_ManAppendCi( pNew );
        Gia_ManPi(p, Vec_IntEntry(vPiPerm,i))->Value = Gia_ManAppendCi( pNew );
//    Vec_IntFree( vPiPermInv );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            if ( Gia_ObjIsRo(p, pObj) )
                pObj->Value = Gia_ManAppendCi( pNew );
        }
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}